

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

VkPipelineStageFlags Diligent::ResourceStateFlagsToVkAccessFlags(RESOURCE_STATE StateFlags)

{
  uint uVar1;
  RESOURCE_STATE RVar2;
  uint uVar3;
  string msg;
  
  if ((RESOURCE_STATE_MAX_BIT|RESOURCE_STATE_COMMON|RESOURCE_STATE_RAY_TRACING|
       RESOURCE_STATE_BUILD_AS_WRITE|RESOURCE_STATE_BUILD_AS_READ|RESOURCE_STATE_PRESENT|
       RESOURCE_STATE_INPUT_ATTACHMENT|RESOURCE_STATE_RESOLVE_SOURCE|RESOURCE_STATE_RESOLVE_DEST|
       RESOURCE_STATE_COPY_SOURCE|RESOURCE_STATE_COPY_DEST|RESOURCE_STATE_INDIRECT_ARGUMENT|
       RESOURCE_STATE_STREAM_OUT|RESOURCE_STATE_SHADER_RESOURCE|RESOURCE_STATE_DEPTH_READ|
       RESOURCE_STATE_DEPTH_WRITE|RESOURCE_STATE_UNORDERED_ACCESS|RESOURCE_STATE_RENDER_TARGET|
       RESOURCE_STATE_INDEX_BUFFER|RESOURCE_STATE_CONSTANT_BUFFER|RESOURCE_STATE_VERTEX_BUFFER|
      RESOURCE_STATE_UNDEFINED) < StateFlags) {
    FormatString<char[38]>(&msg,(char (*) [38])"Resource state flags are out of range");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ResourceStateFlagsToVkAccessFlags",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x524);
    std::__cxx11::string::~string((string *)&msg);
  }
  uVar1 = 0;
  do {
    if (StateFlags == RESOURCE_STATE_UNKNOWN) {
      return uVar1;
    }
    RVar2 = -StateFlags & StateFlags;
    uVar3 = 0;
    switch(RVar2) {
    case RESOURCE_STATE_UNDEFINED:
      break;
    case RESOURCE_STATE_VERTEX_BUFFER:
      uVar3 = 4;
      break;
    case RESOURCE_STATE_VERTEX_BUFFER|RESOURCE_STATE_UNDEFINED:
    case RESOURCE_STATE_CONSTANT_BUFFER|RESOURCE_STATE_UNDEFINED:
    case RESOURCE_STATE_CONSTANT_BUFFER|RESOURCE_STATE_VERTEX_BUFFER:
    case RESOURCE_STATE_CONSTANT_BUFFER|RESOURCE_STATE_VERTEX_BUFFER|RESOURCE_STATE_UNDEFINED:
switchD_00249c59_caseD_3:
      FormatString<char[31]>(&msg,(char (*) [31])"Unexpected resource state flag");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"ResourceStateFlagToVkAccessFlags",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x51d);
      std::__cxx11::string::~string((string *)&msg);
      uVar3 = 0;
      break;
    case RESOURCE_STATE_CONSTANT_BUFFER:
      uVar3 = 8;
      break;
    case RESOURCE_STATE_INDEX_BUFFER:
      uVar3 = 2;
      break;
    default:
      if (RVar2 == RESOURCE_STATE_RENDER_TARGET) {
        uVar3 = 0x180;
      }
      else if (RVar2 == RESOURCE_STATE_UNORDERED_ACCESS) {
        uVar3 = 0x60;
      }
      else if (RVar2 == RESOURCE_STATE_DEPTH_WRITE) {
        uVar3 = 0x600;
      }
      else if (RVar2 == RESOURCE_STATE_DEPTH_READ) {
        uVar3 = 0x200;
      }
      else {
        if (RVar2 == RESOURCE_STATE_SHADER_RESOURCE) goto LAB_00249c5f;
        if (RVar2 == RESOURCE_STATE_STREAM_OUT) {
          uVar3 = 0x2000000;
        }
        else if (RVar2 == RESOURCE_STATE_INDIRECT_ARGUMENT) {
          uVar3 = 1;
        }
        else if (RVar2 == RESOURCE_STATE_COPY_DEST) {
LAB_00249c64:
          uVar3 = 0x1000;
        }
        else {
          if (RVar2 != RESOURCE_STATE_COPY_SOURCE) {
            if (RVar2 == RESOURCE_STATE_RESOLVE_DEST) goto LAB_00249c64;
            if (RVar2 != RESOURCE_STATE_RESOLVE_SOURCE) {
              if (RVar2 == RESOURCE_STATE_INPUT_ATTACHMENT) {
                uVar3 = 0x10;
              }
              else {
                uVar3 = 0;
                if (RVar2 != RESOURCE_STATE_PRESENT) {
                  if (RVar2 == RESOURCE_STATE_BUILD_AS_READ) {
LAB_00249c5f:
                    uVar3 = 0x20;
                  }
                  else if (RVar2 == RESOURCE_STATE_BUILD_AS_WRITE) {
                    uVar3 = 0x600000;
                  }
                  else {
                    if (RVar2 == RESOURCE_STATE_RAY_TRACING) goto LAB_00249c5f;
                    if (RVar2 != RESOURCE_STATE_COMMON) {
                      if (RVar2 != RESOURCE_STATE_MAX_BIT) goto switchD_00249c59_caseD_3;
                      uVar3 = 0x1800000;
                    }
                  }
                }
              }
              break;
            }
          }
          uVar3 = 0x800;
        }
      }
    }
    StateFlags = StateFlags ^ RVar2;
    uVar1 = uVar1 | uVar3;
  } while( true );
}

Assistant:

VkPipelineStageFlags ResourceStateFlagsToVkAccessFlags(RESOURCE_STATE StateFlags)
{
    VERIFY(Uint32{StateFlags} < (RESOURCE_STATE_MAX_BIT << 1), "Resource state flags are out of range");

    VkAccessFlags AccessFlags = 0;
    while (StateFlags != RESOURCE_STATE_UNKNOWN)
    {
        RESOURCE_STATE StateBit = ExtractLSB(StateFlags);
        AccessFlags |= ResourceStateFlagToVkAccessFlags(StateBit);
    }
    return AccessFlags;
}